

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void processIncludeDirectories
               (cmTarget *tgt,
               vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
               *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *includes,
               hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
               *uniqueIncludes,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugIncludes,string *language)

{
  char cVar1;
  long lVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  vector<cmListFileContext,_std::allocator<cmListFileContext>_> *__x;
  bool bVar5;
  PolicyStatus PVar6;
  char *pcVar7;
  ostream *poVar8;
  long *plVar9;
  cmake *this;
  size_type *psVar10;
  long *plVar11;
  PolicyID id;
  PolicyID id_00;
  pointer path;
  MessageType MVar12;
  undefined7 in_stack_00000009;
  pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  __p;
  string usedIncludes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryIncludes;
  string inc;
  string local_2b0;
  cmTarget *local_290;
  undefined4 local_284;
  undefined8 *local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 *local_258;
  long local_250;
  undefined1 local_248;
  undefined7 uStack_247;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  cmMakefile *local_218;
  pointer *local_210;
  PolicyMap *local_208;
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  long *local_1e0 [2];
  long local_1d0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1c0;
  cmGeneratorExpressionDAGChecker *local_1b8;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *local_1b0;
  undefined1 local_1a8 [16];
  cmListFileContext local_198;
  ios_base local_138 [264];
  
  if (entries !=
      (vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
       *)includes) {
    local_218 = tgt->Makefile;
    local_208 = &tgt->PolicyMap;
    local_290 = tgt;
    local_1c0 = includes;
    local_1b8 = (cmGeneratorExpressionDAGChecker *)config;
    local_1b0 = uniqueIncludes;
    do {
      local_280 = (undefined8 *)(*(pointer *)entries)->_M_string_length;
      lVar2 = local_280[4];
      if (lVar2 == 0) {
        local_284 = 0;
      }
      else {
        local_284 = (undefined4)CONCAT71((int7)((ulong)lVar2 >> 8),*(undefined1 *)(lVar2 + 0x2e9));
      }
      cVar1 = *(char *)(local_280 + 0xb);
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar7 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)((*(pointer *)entries)->_M_dataplus)._M_p
                          ,local_218,(string *)CONCAT71(in_stack_00000009,debugIncludes),false,
                          local_290,local_1b8,(string *)__p.first._M_cur);
      std::__cxx11::string::string((string *)local_1a8,pcVar7,(allocator *)&local_258);
      cmSystemTools::ExpandListArgument((string *)local_1a8,&local_238,false);
      local_210 = (pointer *)entries;
      if ((cmListFileContext *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198.Name._M_dataplus._M_p + 1));
      }
      local_258 = &local_248;
      local_250 = 0;
      local_248 = 0;
      path = local_238.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      if (local_238.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_238.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          if (((char)local_284 != '\0') &&
             (bVar5 = cmsys::SystemTools::FileExists((path->_M_dataplus)._M_p), !bVar5)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            MVar12 = FATAL_ERROR;
            if (cVar1 != '\0') {
              PVar6 = cmPolicies::PolicyMap::Get(local_208,CMP0027);
              if (PVar6 != OLD) {
                if (PVar6 != WARN) goto LAB_0029f139;
                cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2b0,(cmPolicies *)0x1b,id_00);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,local_2b0._M_dataplus._M_p,
                                    local_2b0._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                  operator_delete(local_2b0._M_dataplus._M_p,
                                  local_2b0.field_2._M_allocated_capacity + 1);
                }
              }
              MVar12 = AUTHOR_WARNING;
            }
LAB_0029f139:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Imported target \"",0x11);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(char *)*local_280,local_280[1]);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"\" includes non-existent path\n  \"",0x20);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(path->_M_dataplus)._M_p,path->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,
                       "\"\nin its INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n* The path was deleted, renamed, or moved to another location.\n* An install or uninstall procedure did not complete successfully.\n* The installation package was faulty and references files it does not provide.\n"
                       ,0x114);
            pcVar3 = local_290->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar3,MVar12,&local_2b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
              operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1
                             );
            }
            goto LAB_0029f1eb;
          }
          bVar5 = cmsys::SystemTools::FileIsFullPath((path->_M_dataplus)._M_p);
          if (!bVar5) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            if (local_280[1] == 0) {
              PVar6 = cmPolicies::PolicyMap::Get(local_208,CMP0021);
              MVar12 = FATAL_ERROR;
              if (PVar6 == OLD) {
                bVar5 = true;
              }
              else if (PVar6 == WARN) {
                cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2b0,(cmPolicies *)0x15,id);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,local_2b0._M_dataplus._M_p,
                                    local_2b0._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                  operator_delete(local_2b0._M_dataplus._M_p,
                                  local_2b0.field_2._M_allocated_capacity + 1);
                }
                bVar5 = false;
                MVar12 = AUTHOR_WARNING;
              }
              else {
                bVar5 = false;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "Found relative path while evaluating include directories of \"",0x3d);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(local_290->Name)._M_dataplus._M_p,
                                  (local_290->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\":\n  \"",6);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(path->_M_dataplus)._M_p,path->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
              if (!bVar5) goto LAB_0029ec48;
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8)
              ;
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(char *)*local_280,local_280[1]);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,
                         "\" contains relative path in its INTERFACE_INCLUDE_DIRECTORIES:\n  \"",
                         0x42);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(path->_M_dataplus)._M_p,path->_M_string_length);
              MVar12 = FATAL_ERROR;
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
LAB_0029ec48:
              pcVar3 = local_290->Makefile;
              std::__cxx11::stringbuf::str();
              cmMakefile::IssueMessage(pcVar3,MVar12,&local_2b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                operator_delete(local_2b0._M_dataplus._M_p,
                                local_2b0.field_2._M_allocated_capacity + 1);
              }
              if (MVar12 != AUTHOR_WARNING) {
LAB_0029f1eb:
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base(local_138);
                if (local_258 != &local_248) {
                  operator_delete(local_258,CONCAT71(uStack_247,local_248) + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_238);
                return;
              }
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
          bVar5 = cmSystemTools::IsOff((path->_M_dataplus)._M_p);
          if (!bVar5) {
            cmsys::SystemTools::ConvertToUnixSlashes(path);
          }
          local_1a8._0_8_ = &local_198;
          pcVar4 = (path->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar4,pcVar4 + path->_M_string_length);
          cmsys::
          hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::resize((hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                    *)dagChecker,*(long *)((long)&(dagChecker->Target).field_2 + 8) + 1);
          cmsys::
          hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::insert_unique_noresize
                    ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                      *)&local_2b0,
                     (hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                      *)dagChecker,(value_type *)local_1a8);
          if ((local_2b0.field_2._M_local_buf[0] == '\x01') &&
             (std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1b0,(value_type *)local_1a8), (char)language != '\0')) {
            std::operator+(&local_278," * ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_278);
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
            psVar10 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_2b0.field_2._M_allocated_capacity = *psVar10;
              local_2b0.field_2._8_8_ = plVar9[3];
            }
            else {
              local_2b0.field_2._M_allocated_capacity = *psVar10;
              local_2b0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_2b0._M_string_length = plVar9[1];
            *plVar9 = (long)psVar10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_2b0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
              operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((cmListFileContext *)local_1a8._0_8_ != &local_198) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_198.Name._M_dataplus._M_p + 1));
          }
          path = path + 1;
        } while (path != local_238.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
        if (local_250 != 0) {
          this = cmMakefile::GetCMakeInstance(local_218);
          local_1e0[0] = local_1d0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1e0,"Used includes for target ","");
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_1e0,(ulong)(local_290->Name)._M_dataplus._M_p);
          plVar11 = plVar9 + 2;
          if ((long *)*plVar9 == plVar11) {
            local_1f0 = *plVar11;
            lStack_1e8 = plVar9[3];
            local_200 = &local_1f0;
          }
          else {
            local_1f0 = *plVar11;
            local_200 = (long *)*plVar9;
          }
          local_1f8 = plVar9[1];
          *plVar9 = (long)plVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_200);
          psVar10 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_278.field_2._M_allocated_capacity = *psVar10;
            local_278.field_2._8_8_ = plVar9[3];
            local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          }
          else {
            local_278.field_2._M_allocated_capacity = *psVar10;
            local_278._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_278._M_string_length = plVar9[1];
          *plVar9 = (long)psVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_258);
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          psVar10 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_2b0.field_2._M_allocated_capacity = *psVar10;
            local_2b0.field_2._8_8_ = plVar9[3];
          }
          else {
            local_2b0.field_2._M_allocated_capacity = *psVar10;
            local_2b0._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_2b0._M_string_length = plVar9[1];
          *plVar9 = (long)psVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          __x = (vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)
                ((*local_210)->_M_dataplus)._M_p;
          std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::vector
                    ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_1a8,__x)
          ;
          local_198.Name.field_2._8_8_ =
               __x[1].super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_198.Name._M_string_length =
               (size_type)
               __x[1].super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_198.Name.field_2._M_allocated_capacity =
               (size_type)
               __x[1].super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          cmake::IssueMessage(this,LOG,&local_2b0,(cmListFileBacktrace *)local_1a8);
          std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                    ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if (local_200 != &local_1f0) {
            operator_delete(local_200,local_1f0 + 1);
          }
          if (local_1e0[0] != local_1d0) {
            operator_delete(local_1e0[0],local_1d0[0] + 1);
          }
        }
      }
      if (local_258 != &local_248) {
        operator_delete(local_258,CONCAT71(uStack_247,local_248) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_238);
      entries = (vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                 *)(local_210 + 1);
    } while (entries !=
             (vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              *)local_1c0);
  }
  return;
}

Assistant:

static void processIncludeDirectories(cmTarget const* tgt,
      const std::vector<cmTargetInternals::TargetPropertyEntry*> &entries,
      std::vector<std::string> &includes,
      UNORDERED_SET<std::string> &uniqueIncludes,
      cmGeneratorExpressionDAGChecker *dagChecker,
      const std::string& config, bool debugIncludes,
      const std::string& language)
{
  cmMakefile *mf = tgt->GetMakefile();

  for (std::vector<cmTargetInternals::TargetPropertyEntry*>::const_iterator
      it = entries.begin(), end = entries.end(); it != end; ++it)
    {
    cmLinkImplItem const& item = (*it)->LinkImplItem;
    std::string const& targetName = item;
    bool const fromImported = item.Target && item.Target->IsImported();
    bool const checkCMP0027 = item.FromGenex;
    std::vector<std::string> entryIncludes;
    cmSystemTools::ExpandListArgument((*it)->ge->Evaluate(mf,
                                              config,
                                              false,
                                              tgt,
                                              dagChecker, language),
                                    entryIncludes);

    std::string usedIncludes;
    for(std::vector<std::string>::iterator
          li = entryIncludes.begin(); li != entryIncludes.end(); ++li)
      {
      if (fromImported
          && !cmSystemTools::FileExists(li->c_str()))
        {
        std::ostringstream e;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        if (checkCMP0027)
          {
          switch(tgt->GetPolicyStatusCMP0027())
            {
            case cmPolicies::WARN:
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0027) << "\n";
            case cmPolicies::OLD:
              messageType = cmake::AUTHOR_WARNING;
              break;
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::NEW:
              break;
            }
          }
        e << "Imported target \"" << targetName << "\" includes "
             "non-existent path\n  \"" << *li << "\"\nin its "
             "INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n"
             "* The path was deleted, renamed, or moved to another "
             "location.\n"
             "* An install or uninstall procedure did not complete "
             "successfully.\n"
             "* The installation package was faulty and references files it "
             "does not provide.\n";
        tgt->GetMakefile()->IssueMessage(messageType, e.str());
        return;
        }

      if (!cmSystemTools::FileIsFullPath(li->c_str()))
        {
        std::ostringstream e;
        bool noMessage = false;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        if (!targetName.empty())
          {
          e << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_INCLUDE_DIRECTORIES:\n"
            "  \"" << *li << "\"";
          }
        else
          {
          switch(tgt->GetPolicyStatusCMP0021())
            {
            case cmPolicies::WARN:
              {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0021) << "\n";
              messageType = cmake::AUTHOR_WARNING;
              }
              break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
            }
          e << "Found relative path while evaluating include directories of "
          "\"" << tgt->GetName() << "\":\n  \"" << *li << "\"\n";
          }
        if (!noMessage)
          {
          tgt->GetMakefile()->IssueMessage(messageType, e.str());
          if (messageType == cmake::FATAL_ERROR)
            {
            return;
            }
          }
        }

      if (!cmSystemTools::IsOff(li->c_str()))
        {
        cmSystemTools::ConvertToUnixSlashes(*li);
        }
      std::string inc = *li;

      if(uniqueIncludes.insert(inc).second)
        {
        includes.push_back(inc);
        if (debugIncludes)
          {
          usedIncludes += " * " + inc + "\n";
          }
        }
      }
    if (!usedIncludes.empty())
      {
      mf->GetCMakeInstance()->IssueMessage(cmake::LOG,
                            std::string("Used includes for target ")
                            + tgt->GetName() + ":\n"
                            + usedIncludes, (*it)->ge->GetBacktrace());
      }
    }
}